

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O1

int Dch_ObjCheckTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  
  while( true ) {
    pAVar2 = pObj;
    if ((pAVar2 == (Aig_Obj_t *)0x0) || (((uint)*(ulong *)&pAVar2->field_0x18 & 7) == 2)) {
      return 0;
    }
    if ((*(ulong *)&pAVar2->field_0x18 & 0x10) != 0) {
      return 1;
    }
    if (pAVar2->TravId == p->nTravIds) break;
    pAVar2->TravId = p->nTravIds;
    iVar1 = Dch_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe));
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Dch_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pAVar2->pFanin1 & 0xfffffffffffffffe));
    if (iVar1 != 0) {
      return 1;
    }
    pObj = (Aig_Obj_t *)0x0;
    if (p->pEquivs != (Aig_Obj_t **)0x0) {
      pObj = p->pEquivs[pAVar2->Id];
    }
  }
  return 0;
}

Assistant:

int Dch_ObjCheckTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    // check the trivial cases
    if ( pObj == NULL )
        return 0;
    if ( Aig_ObjIsCi(pObj) )
        return 0;
    if ( pObj->fMarkA )
        return 1;
    // skip the visited node
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pObj );
    // check the children
    if ( Dch_ObjCheckTfi_rec( p, Aig_ObjFanin0(pObj) ) )
        return 1;
    if ( Dch_ObjCheckTfi_rec( p, Aig_ObjFanin1(pObj) ) )
        return 1;
    // check equivalent nodes
    return Dch_ObjCheckTfi_rec( p, Aig_ObjEquiv(p, pObj) );
}